

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant1.c
# Opt level: O2

void color_quantize(j_decompress_ptr cinfo,JSAMPARRAY input_buf,JSAMPARRAY output_buf,int num_rows)

{
  JDIMENSION JVar1;
  _func_void_j_decompress_ptr *p_Var2;
  ulong uVar3;
  JDIMENSION JVar4;
  ulong uVar5;
  ulong uVar6;
  JSAMPROW pJVar7;
  JSAMPROW pJVar8;
  ulong uVar9;
  JSAMPLE JVar10;
  bool bVar11;
  
  p_Var2 = cinfo->cquantize[1].finish_pass;
  uVar6 = 0;
  uVar5 = (ulong)(uint)cinfo->out_color_components;
  if (cinfo->out_color_components < 1) {
    uVar5 = uVar6;
  }
  JVar1 = cinfo->output_width;
  uVar3 = (ulong)(uint)num_rows;
  if (num_rows < 1) {
    uVar3 = uVar6;
  }
  for (; uVar6 != uVar3; uVar6 = uVar6 + 1) {
    pJVar7 = input_buf[uVar6];
    pJVar8 = output_buf[uVar6];
    JVar4 = JVar1;
    while (bVar11 = JVar4 != 0, JVar4 = JVar4 - 1, bVar11) {
      JVar10 = '\0';
      for (uVar9 = 0; uVar5 != uVar9; uVar9 = uVar9 + 1) {
        JVar10 = JVar10 + *(char *)(*(long *)(p_Var2 + uVar9 * 8) + (ulong)pJVar7[uVar9]);
      }
      pJVar7 = pJVar7 + uVar5;
      *pJVar8 = JVar10;
      pJVar8 = pJVar8 + 1;
    }
  }
  return;
}

Assistant:

METHODDEF(void)
color_quantize(j_decompress_ptr cinfo, JSAMPARRAY input_buf,
               JSAMPARRAY output_buf, int num_rows)
/* General case, no dithering */
{
  my_cquantize_ptr cquantize = (my_cquantize_ptr)cinfo->cquantize;
  JSAMPARRAY colorindex = cquantize->colorindex;
  register int pixcode, ci;
  register JSAMPROW ptrin, ptrout;
  int row;
  JDIMENSION col;
  JDIMENSION width = cinfo->output_width;
  register int nc = cinfo->out_color_components;

  for (row = 0; row < num_rows; row++) {
    ptrin = input_buf[row];
    ptrout = output_buf[row];
    for (col = width; col > 0; col--) {
      pixcode = 0;
      for (ci = 0; ci < nc; ci++) {
        pixcode += colorindex[ci][*ptrin++];
      }
      *ptrout++ = (JSAMPLE)pixcode;
    }
  }
}